

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SBG.h
# Opt level: O3

int ConnectSBG(SBG *pSBG,char *szCfgFilePath)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  char line [256];
  byte local_138;
  char local_137;
  
  memset(pSBG->szCfgFilePath,0,0x100);
  sprintf(pSBG->szCfgFilePath,"%.255s",szCfgFilePath);
  iVar1 = strncmp(szCfgFilePath,"hardcoded://",0xc);
  if (iVar1 != 0) {
    memset(&local_138,0,0x100);
    memset(pSBG->szDevPath + 5,0,0xfb);
    builtin_strncpy(pSBG->szDevPath,"COM1",5);
    pSBG->BaudRate = 0x1c200;
    pSBG->timeout = 1000;
    pSBG->threadperiod = 0x32;
    pSBG->bSaveRawData = 1;
    pSBG->gpsaccuracythreshold = 10.0;
    pSBG->rollorientation = 0.0;
    pSBG->rollp1 = 0.0;
    pSBG->rollp2 = 0.0;
    pSBG->pitchorientation = 0.0;
    pSBG->pitchp1 = 0.0;
    pSBG->pitchp2 = 0.0;
    pSBG->yaworientation = 0.0;
    pSBG->yawp1 = 0.0;
    pSBG->yawp2 = 0.0;
    __stream = fopen(szCfgFilePath,"r");
    if (__stream == (FILE *)0x0) {
      pcVar2 = "Configuration file not found.";
    }
    else {
LAB_001a4680:
      do {
        pcVar2 = fgets((char *)&local_138,0x100,__stream);
        if (local_138 < 0x25) {
          if (local_138 == 0x23) goto LAB_001a46b7;
          if (local_138 != 0x24) {
LAB_001a46cf:
            if (pcVar2 != (char *)0x0) goto LAB_001a46e0;
          }
          break;
        }
        if (local_138 != 0x25) {
          if (((local_138 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_001a46cf;
          goto LAB_001a4680;
        }
LAB_001a46b7:
      } while (pcVar2 != (char *)0x0);
      puts("Invalid configuration file.");
LAB_001a46e0:
      iVar1 = __isoc99_sscanf(&local_138,"%255s",pSBG->szDevPath);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
LAB_001a470c:
      do {
        pcVar2 = fgets((char *)&local_138,0x100,__stream);
        if (local_138 < 0x25) {
          if (local_138 == 0x23) goto LAB_001a4743;
          if (local_138 != 0x24) {
LAB_001a474f:
            if (pcVar2 != (char *)0x0) goto LAB_001a4760;
          }
          break;
        }
        if (local_138 != 0x25) {
          if (((local_138 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_001a474f;
          goto LAB_001a470c;
        }
LAB_001a4743:
      } while (pcVar2 != (char *)0x0);
      puts("Invalid configuration file.");
LAB_001a4760:
      iVar1 = __isoc99_sscanf(&local_138,"%d",&pSBG->BaudRate);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
LAB_001a478c:
      do {
        pcVar2 = fgets((char *)&local_138,0x100,__stream);
        if (local_138 < 0x25) {
          if (local_138 == 0x23) goto LAB_001a47c3;
          if (local_138 != 0x24) {
LAB_001a47cf:
            if (pcVar2 != (char *)0x0) goto LAB_001a47e0;
          }
          break;
        }
        if (local_138 != 0x25) {
          if (((local_138 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_001a47cf;
          goto LAB_001a478c;
        }
LAB_001a47c3:
      } while (pcVar2 != (char *)0x0);
      puts("Invalid configuration file.");
LAB_001a47e0:
      iVar1 = __isoc99_sscanf(&local_138,"%d",&pSBG->timeout);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
LAB_001a480c:
      do {
        pcVar2 = fgets((char *)&local_138,0x100,__stream);
        if (local_138 < 0x25) {
          if (local_138 == 0x23) goto LAB_001a4843;
          if (local_138 != 0x24) {
LAB_001a484f:
            if (pcVar2 != (char *)0x0) goto LAB_001a4860;
          }
          break;
        }
        if (local_138 != 0x25) {
          if (((local_138 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_001a484f;
          goto LAB_001a480c;
        }
LAB_001a4843:
      } while (pcVar2 != (char *)0x0);
      puts("Invalid configuration file.");
LAB_001a4860:
      iVar1 = __isoc99_sscanf(&local_138,"%d",&pSBG->threadperiod);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
LAB_001a488e:
      do {
        pcVar2 = fgets((char *)&local_138,0x100,__stream);
        if (local_138 < 0x25) {
          if (local_138 == 0x23) goto LAB_001a48c5;
          if (local_138 != 0x24) {
LAB_001a48d1:
            if (pcVar2 != (char *)0x0) goto LAB_001a48e2;
          }
          break;
        }
        if (local_138 != 0x25) {
          if (((local_138 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_001a48d1;
          goto LAB_001a488e;
        }
LAB_001a48c5:
      } while (pcVar2 != (char *)0x0);
      puts("Invalid configuration file.");
LAB_001a48e2:
      iVar1 = __isoc99_sscanf(&local_138,"%d",&pSBG->bSaveRawData);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
LAB_001a4910:
      do {
        pcVar2 = fgets((char *)&local_138,0x100,__stream);
        if (local_138 < 0x25) {
          if (local_138 == 0x23) goto LAB_001a4947;
          if (local_138 != 0x24) {
LAB_001a4953:
            if (pcVar2 != (char *)0x0) goto LAB_001a4964;
          }
          break;
        }
        if (local_138 != 0x25) {
          if (((local_138 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_001a4953;
          goto LAB_001a4910;
        }
LAB_001a4947:
      } while (pcVar2 != (char *)0x0);
      puts("Invalid configuration file.");
LAB_001a4964:
      iVar1 = __isoc99_sscanf(&local_138,"%lf",&pSBG->gpsaccuracythreshold);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
LAB_001a4992:
      do {
        pcVar2 = fgets((char *)&local_138,0x100,__stream);
        if (local_138 < 0x25) {
          if (local_138 == 0x23) goto LAB_001a49c9;
          if (local_138 != 0x24) {
LAB_001a49d5:
            if (pcVar2 != (char *)0x0) goto LAB_001a49e6;
          }
          break;
        }
        if (local_138 != 0x25) {
          if (((local_138 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_001a49d5;
          goto LAB_001a4992;
        }
LAB_001a49c9:
      } while (pcVar2 != (char *)0x0);
      puts("Invalid configuration file.");
LAB_001a49e6:
      iVar1 = __isoc99_sscanf(&local_138,"%lf",&pSBG->rollorientation);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
LAB_001a4a14:
      do {
        pcVar2 = fgets((char *)&local_138,0x100,__stream);
        if (local_138 < 0x25) {
          if (local_138 == 0x23) goto LAB_001a4a4b;
          if (local_138 != 0x24) {
LAB_001a4a57:
            if (pcVar2 != (char *)0x0) goto LAB_001a4a68;
          }
          break;
        }
        if (local_138 != 0x25) {
          if (((local_138 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_001a4a57;
          goto LAB_001a4a14;
        }
LAB_001a4a4b:
      } while (pcVar2 != (char *)0x0);
      puts("Invalid configuration file.");
LAB_001a4a68:
      iVar1 = __isoc99_sscanf(&local_138,"%lf",&pSBG->rollp1);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
LAB_001a4a96:
      do {
        pcVar2 = fgets((char *)&local_138,0x100,__stream);
        if (local_138 < 0x25) {
          if (local_138 == 0x23) goto LAB_001a4acd;
          if (local_138 != 0x24) {
LAB_001a4ad9:
            if (pcVar2 != (char *)0x0) goto LAB_001a4aea;
          }
          break;
        }
        if (local_138 != 0x25) {
          if (((local_138 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_001a4ad9;
          goto LAB_001a4a96;
        }
LAB_001a4acd:
      } while (pcVar2 != (char *)0x0);
      puts("Invalid configuration file.");
LAB_001a4aea:
      iVar1 = __isoc99_sscanf(&local_138,"%lf",&pSBG->rollp2);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
LAB_001a4b18:
      do {
        pcVar2 = fgets((char *)&local_138,0x100,__stream);
        if (local_138 < 0x25) {
          if (local_138 == 0x23) goto LAB_001a4b4f;
          if (local_138 != 0x24) {
LAB_001a4b5b:
            if (pcVar2 != (char *)0x0) goto LAB_001a4b6c;
          }
          break;
        }
        if (local_138 != 0x25) {
          if (((local_138 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_001a4b5b;
          goto LAB_001a4b18;
        }
LAB_001a4b4f:
      } while (pcVar2 != (char *)0x0);
      puts("Invalid configuration file.");
LAB_001a4b6c:
      iVar1 = __isoc99_sscanf(&local_138,"%lf",&pSBG->pitchorientation);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
LAB_001a4b9a:
      do {
        pcVar2 = fgets((char *)&local_138,0x100,__stream);
        if (local_138 < 0x25) {
          if (local_138 == 0x23) goto LAB_001a4bd1;
          if (local_138 != 0x24) {
LAB_001a4bdd:
            if (pcVar2 != (char *)0x0) goto LAB_001a4bee;
          }
          break;
        }
        if (local_138 != 0x25) {
          if (((local_138 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_001a4bdd;
          goto LAB_001a4b9a;
        }
LAB_001a4bd1:
      } while (pcVar2 != (char *)0x0);
      puts("Invalid configuration file.");
LAB_001a4bee:
      iVar1 = __isoc99_sscanf(&local_138,"%lf",&pSBG->pitchp1);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
LAB_001a4c1c:
      do {
        pcVar2 = fgets((char *)&local_138,0x100,__stream);
        if (local_138 < 0x25) {
          if (local_138 == 0x23) goto LAB_001a4c53;
          if (local_138 != 0x24) {
LAB_001a4c5f:
            if (pcVar2 != (char *)0x0) goto LAB_001a4c70;
          }
          break;
        }
        if (local_138 != 0x25) {
          if (((local_138 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_001a4c5f;
          goto LAB_001a4c1c;
        }
LAB_001a4c53:
      } while (pcVar2 != (char *)0x0);
      puts("Invalid configuration file.");
LAB_001a4c70:
      iVar1 = __isoc99_sscanf(&local_138,"%lf",&pSBG->pitchp2);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
LAB_001a4c9e:
      do {
        pcVar2 = fgets((char *)&local_138,0x100,__stream);
        if (local_138 < 0x25) {
          if (local_138 == 0x23) goto LAB_001a4cd5;
          if (local_138 != 0x24) {
LAB_001a4ce1:
            if (pcVar2 != (char *)0x0) goto LAB_001a4cf2;
          }
          break;
        }
        if (local_138 != 0x25) {
          if (((local_138 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_001a4ce1;
          goto LAB_001a4c9e;
        }
LAB_001a4cd5:
      } while (pcVar2 != (char *)0x0);
      puts("Invalid configuration file.");
LAB_001a4cf2:
      iVar1 = __isoc99_sscanf(&local_138,"%lf",&pSBG->yaworientation);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
LAB_001a4d20:
      do {
        pcVar2 = fgets((char *)&local_138,0x100,__stream);
        if (local_138 < 0x25) {
          if (local_138 == 0x23) goto LAB_001a4d57;
          if (local_138 != 0x24) {
LAB_001a4d63:
            if (pcVar2 != (char *)0x0) goto LAB_001a4d74;
          }
          break;
        }
        if (local_138 != 0x25) {
          if (((local_138 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_001a4d63;
          goto LAB_001a4d20;
        }
LAB_001a4d57:
      } while (pcVar2 != (char *)0x0);
      puts("Invalid configuration file.");
LAB_001a4d74:
      iVar1 = __isoc99_sscanf(&local_138,"%lf",&pSBG->yawp1);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
LAB_001a4da2:
      do {
        pcVar2 = fgets((char *)&local_138,0x100,__stream);
        if (local_138 < 0x25) {
          if (local_138 == 0x23) goto LAB_001a4dd9;
          if (local_138 != 0x24) {
LAB_001a4de5:
            if (pcVar2 != (char *)0x0) goto LAB_001a4df6;
          }
          break;
        }
        if (local_138 != 0x25) {
          if (((local_138 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_001a4de5;
          goto LAB_001a4da2;
        }
LAB_001a4dd9:
      } while (pcVar2 != (char *)0x0);
      puts("Invalid configuration file.");
LAB_001a4df6:
      iVar1 = __isoc99_sscanf(&local_138,"%lf",&pSBG->yawp2);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      iVar1 = fclose(__stream);
      if (iVar1 == 0) goto LAB_001a4e41;
      pcVar2 = "fclose() failed.";
    }
    puts(pcVar2);
  }
LAB_001a4e41:
  if (pSBG->threadperiod < 0) {
    puts("Invalid parameter : threadperiod.");
    pSBG->threadperiod = 0x32;
  }
  if (pSBG->gpsaccuracythreshold <= 0.0 && pSBG->gpsaccuracythreshold != 0.0) {
    puts("Invalid parameter : gpsaccuracythreshold.");
    pSBG->gpsaccuracythreshold = 10.0;
  }
  memset(&pSBG->LastSBGData,0,0x11b0);
  iVar1 = OpenRS232Port(&pSBG->RS232Port,pSBG->szDevPath);
  if (iVar1 == 0) {
    iVar1 = (pSBG->RS232Port).DevType;
    if (3 < iVar1 - 1U) {
      if ((iVar1 != 0) ||
         (iVar1 = SetOptionsComputerRS232Port
                            ((pSBG->RS232Port).hDev,pSBG->BaudRate,'\0',0,'\b','\x02',pSBG->timeout)
         , iVar1 != 0)) {
        puts("Unable to connect to a SBG.");
        CloseRS232Port(&pSBG->RS232Port);
        goto LAB_001a4eb3;
      }
      tcflush(*(int *)&(pSBG->RS232Port).hDev,2);
    }
    puts("SBG connected.");
    iVar1 = 0;
  }
  else {
    puts("Unable to connect to a SBG.");
LAB_001a4eb3:
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

inline int ConnectSBG(SBG* pSBG, char* szCfgFilePath)
{
	FILE* file = NULL;
	char line[256];
#ifdef ENABLE_SBG_SDK_SUPPORT
	char address[256];
	int iport = 0, ilport = 0;
#ifndef DISABLE_SBG_TCP
	char port[256];
#endif // DISABLE_SBG_TCP
	char* ptr = NULL;
	char* ptr2 = NULL;
#endif //ENABLE_SBG_SDK_SUPPORT

	memset(pSBG->szCfgFilePath, 0, sizeof(pSBG->szCfgFilePath));
	sprintf(pSBG->szCfgFilePath, "%.255s", szCfgFilePath);

	// If szCfgFilePath starts with "hardcoded://", parameters are assumed to be already set in the structure, 
	// otherwise it should be loaded from a configuration file.
	if (strncmp(szCfgFilePath, "hardcoded://", strlen("hardcoded://")) != 0)
	{
		memset(line, 0, sizeof(line));

		// Default values.
		memset(pSBG->szDevPath, 0, sizeof(pSBG->szDevPath));
		sprintf(pSBG->szDevPath, "COM1");
		pSBG->BaudRate = 115200;
		pSBG->timeout = 1000;
		pSBG->threadperiod = 50;
		pSBG->bSaveRawData = 1;
		pSBG->gpsaccuracythreshold = 10;
		pSBG->rollorientation = 0;
		pSBG->rollp1 = 0;
		pSBG->rollp2 = 0;
		pSBG->pitchorientation = 0;
		pSBG->pitchp1 = 0;
		pSBG->pitchp2 = 0;
		pSBG->yaworientation = 0;
		pSBG->yawp1 = 0;
		pSBG->yawp2 = 0;

		// Load data from a file.
		file = fopen(szCfgFilePath, "r");
		if (file != NULL)
		{
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%255s", pSBG->szDevPath) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSBG->BaudRate) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSBG->timeout) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSBG->threadperiod) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSBG->bSaveRawData) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pSBG->gpsaccuracythreshold) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pSBG->rollorientation) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pSBG->rollp1) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pSBG->rollp2) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pSBG->pitchorientation) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pSBG->pitchp1) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pSBG->pitchp2) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pSBG->yaworientation) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pSBG->yawp1) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pSBG->yawp2) != 1) printf("Invalid configuration file.\n");
			if (fclose(file) != EXIT_SUCCESS) printf("fclose() failed.\n");
		}
		else
		{
			printf("Configuration file not found.\n");
		}
	}

	if (pSBG->threadperiod < 0)
	{
		printf("Invalid parameter : threadperiod.\n");
		pSBG->threadperiod = 50;
	}
	if (pSBG->gpsaccuracythreshold < 0)
	{
		printf("Invalid parameter : gpsaccuracythreshold.\n");
		pSBG->gpsaccuracythreshold = 10;
	}

	// Used to save raw data, should be handled specifically...
	//pSBG->pfSaveFile = NULL;

	memset(&pSBG->LastSBGData, 0, sizeof(SBGDATA));

#ifdef ENABLE_SBG_SDK_SUPPORT
	memset(address, 0, sizeof(address));

	// inet_addr() vs sbgIpAddr()...?

	// Try to determine whether it is a server TCP port (e.g. :4001), client IP address and TCP port (e.g. 127.0.0.1:4001), 
	// IP address and UDP ports (e.g. udp://127.0.0.1:4001:4002) or local RS232 port.
#ifndef DISABLE_SBG_TCP
	memset(port, 0, sizeof(port));

	ptr = strchr(pSBG->szDevPath, ':');
	if ((ptr != NULL)&&(strlen(ptr) >= 6)) ptr2 = strchr(ptr+1, ':');
	if ((strlen(pSBG->szDevPath) >= 12)&&(strncmp(pSBG->szDevPath, "tcpsrv://", strlen("tcpsrv://")) == 0)&&(ptr2 != NULL)&&(ptr2[1] != 0))
	{
		memcpy(address, pSBG->szDevPath+9, ptr2-(pSBG->szDevPath+9));
		strcpy(port, ptr2+1);
		if (sbgInterfaceTcpCreate(&pSBG->sbgInterface, sbgIpAddr(0, 0, 0, 0), atoi(port), true, false, 10000, true) != SBG_NO_ERROR)
		{
			printf("Unable to connect to a SBG : Unable to create the interface.\n");
			return EXIT_FAILURE;
		}
	}
	else if ((strlen(pSBG->szDevPath) >= 9)&&(strncmp(pSBG->szDevPath, "tcp://", strlen("tcp://")) == 0)&&(ptr2 != NULL)&&(ptr2[1] != 0))
	{
		memcpy(address, pSBG->szDevPath+6, ptr2-(pSBG->szDevPath+6));
		strcpy(port, ptr2+1);
		if (sbgInterfaceTcpCreate(&pSBG->sbgInterface, inet_addr(address), atoi(port), false, false, 10000, true) != SBG_NO_ERROR)
		{
			printf("Unable to connect to a SBG : Unable to create the interface.\n");
			return EXIT_FAILURE;
		}
	}
	else if ((strlen(pSBG->szDevPath) >= 9)&&(strncmp(pSBG->szDevPath, "udp://", strlen("udp://")) == 0)&&(ptr2 != NULL)&&(ptr2[1] != 0))
	{
		memcpy(address, pSBG->szDevPath+6, ptr2-(pSBG->szDevPath+6));
		sscanf(ptr2, ":%d:%d", &iport, &ilport);
		if (sbgInterfaceUdpCreate(&pSBG->sbgInterface, inet_addr(address), iport, ilport) != SBG_NO_ERROR)
		{
			printf("Unable to connect to a SBG : Unable to create the interface.\n");
			return EXIT_FAILURE;
		}
	}
	else if ((strlen(pSBG->szDevPath) >= 5)&&(strncmp(pSBG->szDevPath, "tcp:", strlen("tcp:")) == 0)&&(atoi(pSBG->szDevPath+4) > 0))
	{
		strcpy(port, pSBG->szDevPath+4);
		if (sbgInterfaceTcpCreate(&pSBG->sbgInterface, sbgIpAddr(0, 0, 0, 0), atoi(port), true, false, 10000, true) != SBG_NO_ERROR)
		{
			printf("Unable to connect to a SBG : Unable to create the interface.\n");
			return EXIT_FAILURE;
		}
	}
	else if ((pSBG->szDevPath[0] == ':')&&(atoi(pSBG->szDevPath+1) > 0))
	{
		strcpy(port, pSBG->szDevPath+1);
		if (sbgInterfaceTcpCreate(&pSBG->sbgInterface, sbgIpAddr(0, 0, 0, 0), atoi(port), true, false, 10000, true) != SBG_NO_ERROR)
		{
			printf("Unable to connect to a SBG : Unable to create the interface.\n");
			return EXIT_FAILURE;
		}
	}
	else if ((ptr != NULL)&&(ptr[1] != 0))
	{
		memcpy(address, pSBG->szDevPath, ptr-pSBG->szDevPath);
		strcpy(port, ptr+1);
		if (sbgInterfaceTcpCreate(&pSBG->sbgInterface, inet_addr(address), atoi(port), false, false, 10000, true) != SBG_NO_ERROR)
		{
			printf("Unable to connect to a SBG : Unable to create the interface.\n");
			return EXIT_FAILURE;
		}
	}
	else
	{
		if (sbgInterfaceSerialCreate(&pSBG->sbgInterface, pSBG->szDevPath, pSBG->BaudRate) != SBG_NO_ERROR)
		{
			printf("Unable to connect to a SBG : Unable to create the interface.\n");
			return EXIT_FAILURE;
		}
	}
#else
	ptr = strchr(pSBG->szDevPath, ':');
	if ((ptr != NULL)&&(strlen(ptr) >= 6)) ptr2 = strchr(ptr+1, ':');
	if ((strlen(pSBG->szDevPath) >= 9)&&(strncmp(pSBG->szDevPath, "udp://", strlen("udp://")) == 0)&&(ptr2 != NULL)&&(ptr2[1] != 0))
	{
		memcpy(address, pSBG->szDevPath+6, ptr2-(pSBG->szDevPath+6));
		sscanf(ptr2, ":%d:%d", &iport, &ilport);
		if (sbgInterfaceUdpCreate(&pSBG->sbgInterface, inet_addr(address), iport, ilport) != SBG_NO_ERROR)
		{
			printf("Unable to connect to a SBG : Unable to create the interface.\n");
			return EXIT_FAILURE;
		}
	}
	else
	{
		if (sbgInterfaceSerialCreate(&pSBG->sbgInterface, pSBG->szDevPath, pSBG->BaudRate) != SBG_NO_ERROR)
		{
			printf("Unable to connect to a SBG : Unable to create the interface.\n");
			return EXIT_FAILURE;
		}
	} 	  
#endif // DISABLE_SBG_TCP

	mSleep(500); // Needed sometimes to allow non-blocking sockets to be ready...

	if (sbgEComInit(&pSBG->comHandle, &pSBG->sbgInterface) != SBG_NO_ERROR)
	{
#if (SBG_E_COM_VERSION_MAJOR >= 3)
		printf("Unable to connect to a SBG : Unable to initialize the sbgECom library.\n");
		sbgInterfaceDestroy(&pSBG->sbgInterface);
#else
		if (pSBG->sbgInterface.type == SBG_IF_TYPE_SERIAL)
		{
			printf("Unable to connect to a SBG : Unable to initialize the sbgECom library.\n");
			sbgInterfaceSerialDestroy(&pSBG->sbgInterface);
		}
		else if (pSBG->sbgInterface.type == SBG_IF_TYPE_ETH_UDP)
		{
			printf("Unable to connect to a SBG : Unable to initialize the sbgECom library.\n");
			sbgInterfaceUdpDestroy(&pSBG->sbgInterface);
		}
#ifndef DISABLE_SBG_TCP
		else if (pSBG->sbgInterface.type == SBG_IF_TYPE_ETH_TCP_IP)
		{
			printf("Unable to connect to a SBG : Unable to initialize the sbgECom library.\n");
			sbgInterfaceTcpDestroy(&pSBG->sbgInterface);
		}
#endif // DISABLE_SBG_TCP
		else
		{
			printf("Unable to connect to a SBG : Unable to initialize the sbgECom library and unsupported interface type.\n");
		}
#endif // (SBG_E_COM_VERSION_MAJOR >= 3)
		return EXIT_FAILURE;
	}

	if (sbgEComCmdGetInfo(&pSBG->comHandle, &pSBG->deviceInfo) != SBG_NO_ERROR)
	{
		sbgEComClose(&pSBG->comHandle);
#if (SBG_E_COM_VERSION_MAJOR >= 3)
		printf("Unable to connect to a SBG : Unable to get device information.\n");
		sbgInterfaceDestroy(&pSBG->sbgInterface);
#else
		if (pSBG->sbgInterface.type == SBG_IF_TYPE_SERIAL)
		{
			printf("Unable to connect to a SBG : Unable to get device information.\n");
			sbgInterfaceSerialDestroy(&pSBG->sbgInterface);
		}
		else if (pSBG->sbgInterface.type == SBG_IF_TYPE_ETH_UDP)
		{
			printf("Unable to connect to a SBG : Unable to get device information.\n");
			sbgInterfaceUdpDestroy(&pSBG->sbgInterface);
		}
#ifndef DISABLE_SBG_TCP
		else if (pSBG->sbgInterface.type == SBG_IF_TYPE_ETH_TCP_IP)
		{
			printf("Unable to connect to a SBG : Unable to get device information.\n");
			sbgInterfaceTcpDestroy(&pSBG->sbgInterface);
		}
#endif // DISABLE_SBG_TCP
		else
		{
			printf("Unable to connect to a SBG : Unable to get device information and unsupported interface type.\n");
		}
#endif // (SBG_E_COM_VERSION_MAJOR >= 3)
		return EXIT_FAILURE;
	}

	sbgEComSetReceiveLogCallback(&pSBG->comHandle, OnLogReceivedSBG, (void*)pSBG);

	if (InitCriticalSection(&pSBG->CallbackCS) != EXIT_SUCCESS)
	{
		sbgEComClose(&pSBG->comHandle);
#if (SBG_E_COM_VERSION_MAJOR >= 3)
		printf("Unable to connect to a SBG : InitCriticalSection() failed.\n");
		sbgInterfaceDestroy(&pSBG->sbgInterface);
#else
		if (pSBG->sbgInterface.type == SBG_IF_TYPE_SERIAL)
		{
			printf("Unable to connect to a SBG : InitCriticalSection() failed.\n");
			sbgInterfaceSerialDestroy(&pSBG->sbgInterface);
		}
		else if (pSBG->sbgInterface.type == SBG_IF_TYPE_ETH_UDP)
		{
			printf("Unable to connect to a SBG : InitCriticalSection() failed.\n");
			sbgInterfaceUdpDestroy(&pSBG->sbgInterface);
		}
#ifndef DISABLE_SBG_TCP
		else if (pSBG->sbgInterface.type == SBG_IF_TYPE_ETH_TCP_IP)
		{
			printf("Unable to connect to a SBG : InitCriticalSection() failed.\n");
			sbgInterfaceTcpDestroy(&pSBG->sbgInterface);
		}
#endif // DISABLE_SBG_TCP
		else
		{
			printf("Unable to connect to a SBG : InitCriticalSection() failed and unsupported interface type.\n");
		}
#endif // (SBG_E_COM_VERSION_MAJOR >= 3)
		return EXIT_FAILURE;
	}
#else
	if (OpenRS232Port(&pSBG->RS232Port, pSBG->szDevPath) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a SBG.\n");
		return EXIT_FAILURE;
	}

	if (SetOptionsRS232Port(&pSBG->RS232Port, pSBG->BaudRate, NOPARITY, FALSE, 8, 
		TWOSTOPBITS, (UINT)pSBG->timeout) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a SBG.\n");
		CloseRS232Port(&pSBG->RS232Port);
		return EXIT_FAILURE;
	}
#endif // ENABLE_SBG_SDK_SUPPORT

	printf("SBG connected.\n");

	return EXIT_SUCCESS;
}